

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiramHdiv.cpp
# Opt level: O1

int pzshape::TPZShapePiramHdiv::NConnectShapeF(int side,int order)

{
  int iVar1;
  
  if (0xd < (uint)side) {
    iVar1 = TPZShapePiram::NConnectShapeF(side,order);
    return iVar1;
  }
  if ((0x21efU >> (side & 0x1fU) & 1) == 0) {
    iVar1 = 0;
    if (side != 4) {
      iVar1 = TPZShapePiram::NConnectShapeF(side,order);
      return iVar1;
    }
  }
  else {
    iVar1 = TPZShapePiram::NConnectShapeF(side,order);
    iVar1 = iVar1 * 2;
  }
  return iVar1;
}

Assistant:

int TPZShapePiramHdiv::NConnectShapeF(int side, int order) {
        switch (side) {
            case 0:
            case 1:
            case 2:
            case 3:
            case 5:
            case 6:
            case 7:
            case 8:
            case 13:
                
                return TPZShapePiram::NConnectShapeF(side, order)*2;
                break;
            case 4:
                return 0;
                break;
            default:
                return TPZShapePiram::NConnectShapeF(side, order);
                break;
        }
    }